

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O0

void * readline_stdin(void *arg)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  void *__dest;
  char *str;
  char local_418 [4];
  int n;
  char tmp [1024];
  queue_conflict *q;
  void *arg_local;
  
  tmp._1016_8_ = arg;
  while( true ) {
    iVar1 = feof(_stdin);
    if (iVar1 != 0) {
      return (void *)0x0;
    }
    pcVar2 = fgets(local_418,0x400,_stdin);
    if (pcVar2 == (char *)0x0) break;
    sVar3 = strlen(local_418);
    iVar1 = (int)sVar3 + -1;
    __dest = malloc((long)(int)sVar3);
    memcpy(__dest,local_418,(long)iVar1);
    *(undefined1 *)((long)__dest + (long)iVar1) = 0;
    pthread_mutex_lock((pthread_mutex_t *)tmp._1016_8_);
    *(void **)(tmp._1016_8_ + 0x30 + (long)*(int *)(tmp._1016_8_ + 0x2c) * 8) = __dest;
    iVar1 = *(int *)(tmp._1016_8_ + 0x2c) + 1;
    *(int *)(tmp._1016_8_ + 0x2c) = iVar1;
    if (0x3ff < iVar1) {
      *(undefined4 *)(tmp._1016_8_ + 0x2c) = 0;
    }
    if (*(int *)(tmp._1016_8_ + 0x28) == *(int *)(tmp._1016_8_ + 0x2c)) {
      exit(1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)tmp._1016_8_);
  }
  exit(1);
}

Assistant:

static void *
readline_stdin(void * arg) {
	struct queue * q = arg;
	char tmp[1024];
	while (!feof(stdin)) {
		if (fgets(tmp,sizeof(tmp),stdin) == NULL) {
			// read stdin failed
			exit(1);
		}
		int n = strlen(tmp) -1;

		char * str = malloc(n+1);
		memcpy(str, tmp, n);
		str[n] = 0;

		pthread_mutex_lock(&q->lock);
		q->queue[q->tail] = str;

		if (++q->tail >= QUEUE_SIZE) {
			q->tail = 0;
		}
		if (q->head == q->tail) {
			// queue overflow
			exit(1);
		}
		pthread_mutex_unlock(&q->lock);
	}
	return NULL;
}